

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operator.cpp
# Opt level: O1

Type * slang::ast::OpInfo::binaryType
                 (Compilation *compilation,Type *lt,Type *rt,bool forceFourState,
                 bool signednessFromRt)

{
  bool bVar1;
  bitmask<slang::ast::IntegralFlags> bVar2;
  bitmask<slang::ast::IntegralFlags> bVar3;
  bitwidth_t bVar4;
  bitwidth_t bVar5;
  Type *rhs;
  byte bVar6;
  byte bVar7;
  
  bVar1 = Type::isNumeric(lt);
  if ((!bVar1) || (bVar1 = Type::isNumeric(rt), !bVar1)) {
    return compilation->errorType;
  }
  bVar1 = Type::isMatching(lt,rt);
  if (bVar1) {
    if (!forceFourState) {
      return lt;
    }
    bVar1 = Type::isFourState(lt);
    if (bVar1) {
      return lt;
    }
    if (lt->canonical == (Type *)0x0) {
      Type::resolveCanonical(lt);
    }
    if ((lt->canonical->super_Symbol).kind == EnumType) {
      return lt;
    }
  }
  if (lt->canonical == (Type *)0x0) {
    Type::resolveCanonical(lt);
  }
  if ((lt->canonical->super_Symbol).kind != FloatingType) {
    if (rt->canonical == (Type *)0x0) {
      Type::resolveCanonical(rt);
    }
    if ((rt->canonical->super_Symbol).kind != FloatingType) {
      bVar5 = Type::getBitWidth(lt);
      bVar4 = Type::getBitWidth(rt);
      if (bVar4 < bVar5) {
        bVar4 = bVar5;
      }
      bVar2 = Type::getIntegralFlags(lt);
      bVar3 = Type::getIntegralFlags(rt);
      bVar6 = (signednessFromRt | bVar2.m_bits) & bVar3.m_bits & 1;
      bVar7 = bVar6 | 2;
      if (((bVar2.m_bits | bVar3.m_bits) & 2) != 0) {
        bVar6 = bVar7;
      }
      if (forceFourState) {
        bVar6 = bVar7;
      }
      bVar2.m_bits = bVar3.m_bits & bVar2.m_bits & 4 | bVar6;
      if (bVar4 == 1) {
        if (lt->canonical == (Type *)0x0) {
          Type::resolveCanonical(lt);
        }
        if ((lt->canonical->super_Symbol).kind != ScalarType) {
          if (rt->canonical == (Type *)0x0) {
            Type::resolveCanonical(rt);
          }
          if ((rt->canonical->super_Symbol).kind != ScalarType) goto LAB_004b1d02;
        }
        rhs = Compilation::getScalarType(compilation,bVar2);
      }
      else {
LAB_004b1d02:
        rhs = Compilation::getType(compilation,bVar4,bVar2);
      }
      goto LAB_004b1d13;
    }
  }
  if (lt->canonical == (Type *)0x0) {
    Type::resolveCanonical(lt);
  }
  if (((lt->canonical->super_Symbol).kind != FloatingType) ||
     (bVar4 = Type::getBitWidth(lt), bVar4 != 0x40)) {
    if (rt->canonical == (Type *)0x0) {
      Type::resolveCanonical(rt);
    }
    if (((rt->canonical->super_Symbol).kind != FloatingType) ||
       (bVar4 = Type::getBitWidth(rt), bVar4 != 0x40)) {
      rhs = compilation->shortRealType;
      goto LAB_004b1d13;
    }
  }
  rhs = compilation->realType;
LAB_004b1d13:
  bVar1 = Type::isMatching(lt,rhs);
  if ((!bVar1) && (bVar1 = Type::isMatching(rt,rhs), lt = rhs, bVar1)) {
    lt = rt;
  }
  return lt;
}

Assistant:

const Type* OpInfo::binaryType(Compilation& compilation, const Type* lt, const Type* rt,
                               bool forceFourState, bool signednessFromRt) {
    if (!lt->isNumeric() || !rt->isNumeric())
        return &compilation.getErrorType();

    // If both sides are the same type just use that type.
    // NOTE: This specifically ignores the forceFourState option for enums,
    // as that better matches expectations. This area of the LRM is underspecified.
    if (lt->isMatching(*rt)) {
        if (!forceFourState || lt->isFourState() || lt->isEnum())
            return lt;
    }

    // Figure out what the result type of an arithmetic binary operator should be. The rules are:
    // - If either operand is real, the result is real
    // - Otherwise, if either operand is shortreal, the result is shortreal
    // - Otherwise, result is integral with the following properties:
    //      - Bit width is max(lhs, rhs)
    //      - If either operand is four state (or if we force it), the result is four state
    //      - If either operand is unsigned, the result is unsigned
    const Type* result;
    if (lt->isFloating() || rt->isFloating()) {
        if ((lt->isFloating() && lt->getBitWidth() == 64) ||
            (rt->isFloating() && rt->getBitWidth() == 64)) {
            result = &compilation.getRealType();
        }
        else {
            result = &compilation.getShortRealType();
        }
    }
    else {
        bitwidth_t width = std::max(lt->getBitWidth(), rt->getBitWidth());

        bitmask<IntegralFlags> lf = lt->getIntegralFlags();
        bitmask<IntegralFlags> rf = rt->getIntegralFlags();

        bitmask<IntegralFlags> flags;
        if (rf & IntegralFlags::Signed) {
            if ((lf & IntegralFlags::Signed) || signednessFromRt)
                flags |= IntegralFlags::Signed;
        }

        if (forceFourState || (lf & IntegralFlags::FourState) || (rf & IntegralFlags::FourState))
            flags |= IntegralFlags::FourState;
        if ((lf & IntegralFlags::Reg) && (rf & IntegralFlags::Reg))
            flags |= IntegralFlags::Reg;

        // If the width is 1, try to preserve whether this was a packed array with a width of 1
        // or a plain scalar type with no dimensions specified.
        if (width == 1 && (lt->isScalar() || rt->isScalar()))
            result = &compilation.getScalarType(flags);
        else
            result = &compilation.getType(width, flags);
    }

    // Attempt to preserve any type aliases passed in when selecting the result.
    if (lt->isMatching(*result))
        return lt;
    if (rt->isMatching(*result))
        return rt;

    return result;
}